

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O3

INT Internal_AddPaddingVfwprintf
              (CPalThread *pthrCurrent,PAL_FILE *stream,LPWSTR In,INT Padding,INT Flags,BOOL convert
              )

{
  int iVar1;
  errno_t eVar2;
  int iVar3;
  size_t sVar4;
  CPalThread *pthrCurrent_00;
  int *piVar5;
  CPalThread *_Dst;
  undefined4 in_register_00000084;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar9 = (ulong)In & 0xffffffff;
  sVar4 = PAL_wcslen((char16_t *)stream);
  iVar7 = (int)In;
  iVar3 = 0;
  if (0 < iVar7) {
    iVar3 = iVar7;
  }
  iVar1 = (int)sVar4;
  iVar6 = iVar3 + iVar1 + 1;
  pthrCurrent_00 = (CPalThread *)CorUnix::InternalMalloc((long)iVar6 * 2);
  if (pthrCurrent_00 == (CPalThread *)0x0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar5 = __errno_location();
      *piVar5 = 8;
      return -1;
    }
    goto LAB_00318f2d;
  }
  _Dst = pthrCurrent_00;
  if ((Padding & 1U) == 0) {
LAB_00318e7b:
    if (0 < iVar7) {
      iVar6 = iVar6 - iVar7;
      if ((Padding & 4U) == 0) {
        do {
          *(undefined2 *)&_Dst->_vptr_CPalThread = 0x20;
          _Dst = (CPalThread *)((long)&_Dst->_vptr_CPalThread + 2);
          uVar8 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar8;
        } while (uVar8 != 0);
      }
      else {
        do {
          *(undefined2 *)&_Dst->_vptr_CPalThread = 0x30;
          _Dst = (CPalThread *)((long)&_Dst->_vptr_CPalThread + 2);
          uVar8 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar8;
        } while (uVar8 != 0);
      }
    }
    if (((Padding & 1U) != 0) ||
       (eVar2 = wcscpy_s((char16_t_conflict *)_Dst,(long)iVar6,(char16_t_conflict *)stream),
       eVar2 == 0)) {
      if (iVar3 + iVar1 < 1) {
        iVar3 = 0;
LAB_00318f35:
        CorUnix::InternalFree(pthrCurrent_00);
        return iVar3;
      }
      iVar3 = Internal_Convertfwrite
                        (pthrCurrent_00,(void *)(ulong)(uint)(iVar3 + iVar1),
                         (size_t)pthrCurrent->_vptr_CPalThread,(size_t)pthrCurrent_00,
                         (FILE *)CONCAT44(in_register_00000084,Flags),convert);
      if ((iVar3 != -1) || (iVar3 = -1, PAL_InitializeChakraCoreCalled != false)) goto LAB_00318f35;
      goto LAB_00318f2d;
    }
  }
  else {
    eVar2 = wcscpy_s((char16_t_conflict *)pthrCurrent_00,(long)iVar6,(char16_t_conflict *)stream);
    if (eVar2 == 0) {
      _Dst = (CPalThread *)((long)&pthrCurrent_00->_vptr_CPalThread + (long)iVar1 * 2);
      iVar6 = iVar6 - iVar1;
      goto LAB_00318e7b;
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    CorUnix::InternalFree(pthrCurrent_00);
    piVar5 = __errno_location();
    *piVar5 = 0x7a;
    return -1;
  }
LAB_00318f2d:
  abort();
}

Assistant:

static INT Internal_AddPaddingVfwprintf(CPalThread *pthrCurrent, PAL_FILE *stream, LPWSTR In,
                                       INT Padding, INT Flags,BOOL convert)
{
    LPWSTR Out;
    LPWSTR OutOriginal;
    INT LengthInStr;
    INT Length;
    INT Written = 0;

    LengthInStr = PAL_wcslen(In);
    Length = LengthInStr;

    if (Padding > 0)
    {
        Length += Padding;
    }

    int iLen = (Length+1);
    Out = (LPWSTR) InternalMalloc(iLen * sizeof(WCHAR));
    if (!Out)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return -1;
    }
    OutOriginal = Out;

    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (wcscpy_s(Out, iLen, In) != SAFECRT_SUCCESS)
        {
            ERROR("wcscpy_s failed!\n");
            InternalFree(OutOriginal);
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            return -1;
        }
        Out += LengthInStr;
        iLen -= LengthInStr;
    }
    if (Padding > 0)
    {
        iLen -= Padding;
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding--)
            {
                *Out++ = '0';
            }
        }
        else /* pad with spaces */
        {
            while (Padding--)
            {
                *Out++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (wcscpy_s(Out, iLen, In) != SAFECRT_SUCCESS)
        {
            ERROR("wcscpy_s failed!\n");
            InternalFree(OutOriginal);
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            return -1;
        }

        Out += LengthInStr;
        iLen -= LengthInStr;
    }

    if (Length > 0) {
        Written = Internal_Convertfwrite(pthrCurrent, OutOriginal, sizeof(char16_t), Length,
            (FILE*)(stream->bsdFilePtr), convert);

        if (-1 == Written)
        {
            ERROR("fwrite() failed with errno == %d\n", errno);
        }
    }
    InternalFree(OutOriginal);

    return Written;
}